

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void do_load_sel_object_search_proc(Am_Object *cmd)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  anon_union_8_8_ea4c8939_for_value aVar4;
  Am_Wrapper *in_value;
  Am_Slot_Key key_00;
  Am_Am_Slot_Key key;
  Am_Object selected;
  Am_Value local_a8;
  Am_Object search_widget;
  Am_Object item;
  Am_Assoc as;
  Am_Value_List slots_to_item;
  Am_Object sel_widget;
  undefined1 local_68 [8];
  Am_Value v;
  Am_Value_List slots_to_save;
  Am_Value_List sel_list;
  
  Am_Object::Get_Object((Am_Object *)&slots_to_item,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&search_widget,(Am_Slot_Flags)&slots_to_item);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item);
  pAVar3 = Am_Object::Get(&search_widget,0x197,0);
  Am_Object::Am_Object(&sel_widget,pAVar3);
  pAVar3 = Am_Object::Get(&search_widget,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List(&slots_to_item,pAVar3);
  pAVar3 = Am_Object::Get(&sel_widget,0x169,0);
  Am_Value_List::Am_Value_List(&sel_list,pAVar3);
  pAVar3 = Am_Value_List::Get_First(&sel_list);
  Am_Object::Am_Object(&selected,pAVar3);
  pAVar3 = Am_Object::Get(&selected,0xb8,0);
  Am_Value_List::Am_Value_List(&slots_to_save,pAVar3);
  as.data = (Am_Assoc_Data *)0x0;
  key.value = 0;
  item.data = (Am_Object_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&slots_to_item);
  do {
    bVar1 = Am_Value_List::Last(&slots_to_item);
    if (bVar1) {
      Am_Value::~Am_Value(&v);
      Am_Object::~Am_Object(&item);
      Am_Assoc::~Am_Assoc(&as);
      Am_Value_List::~Am_Value_List(&slots_to_save);
      Am_Object::~Am_Object(&selected);
      Am_Value_List::~Am_Value_List(&sel_list);
      Am_Value_List::~Am_Value_List(&slots_to_item);
      Am_Object::~Am_Object(&sel_widget);
      Am_Object::~Am_Object(&search_widget);
      return;
    }
    pAVar3 = Am_Value_List::Get(&slots_to_item);
    Am_Assoc::operator=(&as,pAVar3);
    Am_Assoc::Value_1((Am_Assoc *)&local_a8);
    Am_Am_Slot_Key::operator=(&key,&local_a8);
    Am_Value::~Am_Value(&local_a8);
    aVar4.long_value._2_6_ = 0;
    aVar4.long_value._0_2_ = key.value;
    if (aVar4.wrapper_value == (Am_Wrapper *)0xb) {
      Am_Object::Get_Prototype((Am_Object *)&local_a8);
      in_value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_a8);
      Am_Value::operator=(&v,in_value);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      bVar1 = true;
    }
    else {
      local_a8.type = 0x4015;
      local_a8.value = aVar4;
      bVar1 = Am_Value_List::Start_Member(&slots_to_save,&local_a8);
      Am_Value::~Am_Value(&local_a8);
      if (bVar1) {
        pAVar3 = Am_Object::Get(&selected,key.value,1);
        Am_Value::operator=(&v,pAVar3);
        bVar2 = Am_Value::Exists(&v);
        bVar1 = true;
        if (!bVar2) {
          Am_Value::operator=(&v,0);
        }
      }
      else {
        pAVar3 = Am_Object::Get(&selected,key.value,1);
        Am_Value::operator=(&v,pAVar3);
        bVar1 = false;
      }
    }
    Am_Assoc::Value_2((Am_Assoc *)&local_a8);
    Am_Object::operator=(&item,&local_a8);
    Am_Value::~Am_Value(&local_a8);
    bVar2 = Am_Value::Exists(&v);
    key_00 = (Am_Slot_Key)&item;
    pAVar3 = &local_a8;
    if (bVar2) {
      Am_Object::Get_Object((Am_Object *)&local_a8,key_00,(ulong)Am_USE_ITEM);
      Am_Object::Set((Am_Object *)&local_a8,0x169,bVar1,0);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      if (key.value == 0xb) {
        Am_Object::Am_Object((Am_Object *)local_68,&v);
        set_type_of_search(&item,(Am_Object *)local_68);
        pAVar3 = (Am_Value *)local_68;
      }
      else {
        Am_Object::Get_Object((Am_Object *)&local_a8,key_00,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0x169,&v,0);
        Am_Object::~Am_Object((Am_Object *)&local_a8);
        Am_Object::Get_Object((Am_Object *)&local_a8,key_00,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0xfa,&v,0);
      }
LAB_002168fd:
      Am_Object::~Am_Object((Am_Object *)pAVar3);
    }
    else {
      Am_Object::Get_Object((Am_Object *)&local_a8,key_00,(ulong)Am_USE_ITEM);
      Am_Object::Set((Am_Object *)&local_a8,0x169,false,0);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      if (key.value != 0xb) {
        Am_Object::Get_Object((Am_Object *)&local_a8,key_00,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0x169,"",0);
        goto LAB_002168fd;
      }
    }
    Am_Value_List::Next(&slots_to_item);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_load_sel_object_search,
                 (Am_Object cmd))
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);
  Am_Value_List sel_list = sel_widget.Get(Am_VALUE);
  Am_Object selected = sel_list.Get_First();
  Am_Value_List slots_to_save = selected.Get(Am_SLOTS_TO_SAVE);
  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  bool set_on;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    key = as.Value_1();
    set_on = true;
    if ((Am_Slot_Key)key == Am_PROTOTYPE)
      v = selected.Get_Prototype();
    else if (slots_to_save.Start_Member(key)) {
      v = selected.Peek(key);
      if (!v.Exists())
        v = 0; //supposed to be in this object, but invalid
    } else {
      set_on = false;
      v = selected.Peek(key);
    }
    item = as.Value_2();
    if (v.Exists()) {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, set_on);
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        set_type_of_search(item, v);
      else {
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, v);
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, v);
      }
    } else {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, false);
      if ((Am_Slot_Key)key != Am_PROTOTYPE)
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, "");
    }
  }
}